

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

void pythonAttributeDecl(void *user_data,xmlChar *elem,xmlChar *name,int type,int def,
                        xmlChar *defaultValue,xmlEnumerationPtr tree)

{
  int iVar1;
  PyObject *op;
  PyObject *pPVar2;
  long lVar3;
  int local_5c;
  int count;
  PyObject *result;
  xmlEnumerationPtr node;
  PyObject *newName;
  PyObject *nameList;
  PyObject *handler;
  xmlChar *defaultValue_local;
  int def_local;
  int type_local;
  xmlChar *name_local;
  xmlChar *elem_local;
  void *user_data_local;
  
  iVar1 = PyObject_HasAttrString(user_data,"attributeDecl");
  if (iVar1 != 0) {
    local_5c = 0;
    for (result = (PyObject *)tree; result != (PyObject *)0x0;
        result = (PyObject *)result->ob_refcnt) {
      local_5c = local_5c + 1;
    }
    op = (PyObject *)PyList_New((long)local_5c);
    local_5c = 0;
    for (result = (PyObject *)tree; result != (PyObject *)0x0;
        result = (PyObject *)result->ob_refcnt) {
      pPVar2 = (PyObject *)PyUnicode_FromString(result->ob_type);
      PyList_SetItem(op,(long)local_5c,pPVar2);
      _Py_DECREF(pPVar2);
      local_5c = local_5c + 1;
    }
    pPVar2 = (PyObject *)
             _PyObject_CallMethod_SizeT
                       (user_data,"attributeDecl","ssiisO",elem,name,type,def,defaultValue,op);
    lVar3 = PyErr_Occurred();
    if (lVar3 != 0) {
      PyErr_Print();
    }
    _Py_XDECREF(op);
    _Py_XDECREF(pPVar2);
  }
  return;
}

Assistant:

static void
pythonAttributeDecl(void *user_data,
                    const xmlChar * elem,
                    const xmlChar * name,
                    int type,
                    int def,
                    const xmlChar * defaultValue, xmlEnumerationPtr tree)
{
    PyObject *handler;
    PyObject *nameList;
    PyObject *newName;
    xmlEnumerationPtr node;
    PyObject *result;
    int count;

    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "attributeDecl")) {
        count = 0;
        for (node = tree; node != NULL; node = node->next) {
            count++;
        }
        nameList = PyList_New(count);
        count = 0;
        for (node = tree; node != NULL; node = node->next) {
            newName = PY_IMPORT_STRING((char *) node->name);
            PyList_SetItem(nameList, count, newName);
	    Py_DECREF(newName);
            count++;
        }
        result = PyObject_CallMethod(handler, (char *) "attributeDecl",
                                     (char *) "ssiisO", elem, name, type,
                                     def, defaultValue, nameList);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(nameList);
        Py_XDECREF(result);
    }
}